

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::DumpRange(DBImpl *this,string *fname,Slice *start,Slice *end)

{
  _func_int **pp_Var1;
  DBImpl *pDVar2;
  Comparator *pCVar3;
  char cVar4;
  int iVar5;
  TableBuilder *this_00;
  long *plVar6;
  uint64_t uVar7;
  Slice SVar8;
  WritableFile *file;
  ReadOptions readoption;
  Options options;
  Slice local_f0;
  WritableFile *local_e0;
  DBImpl *local_d8;
  string *local_d0;
  Slice *local_c8;
  void *local_c0;
  void *local_b8;
  Slice local_b0;
  undefined2 local_a0;
  undefined8 local_98;
  Options local_90;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_d8 = this;
  (**(code **)(*(long *)fname->_M_string_length + 0x20))
            (&local_b8,(long *)fname->_M_string_length,start,&local_e0);
  if (local_b8 != (void *)0x0) {
    operator_delete__(local_b8);
  }
  Options::Options(&local_90);
  local_90.filter_policy = (FilterPolicy *)0x0;
  local_90.compression = kSnappyCompression;
  this_00 = (TableBuilder *)operator_new(8);
  local_c8 = start;
  TableBuilder::TableBuilder(this_00,&local_90,local_e0);
  local_a0 = 0x100;
  local_98 = 0;
  local_d0 = fname;
  plVar6 = (long *)(**(code **)((fname->_M_dataplus)._M_p + 0x30))(fname);
  (**(code **)(*plVar6 + 0x28))(plVar6,end);
  while (cVar4 = (**(code **)(*plVar6 + 0x10))(plVar6), pCVar3 = local_90.comparator, cVar4 != '\0')
  {
    SVar8 = (Slice)(**(code **)(*plVar6 + 0x40))(plVar6);
    local_f0 = SVar8;
    iVar5 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_f0);
    if (-1 < iVar5) break;
    SVar8 = (Slice)(**(code **)(*plVar6 + 0x40))(plVar6);
    local_f0 = SVar8;
    SVar8 = (Slice)(**(code **)(*plVar6 + 0x48))(plVar6);
    local_b0 = SVar8;
    TableBuilder::Add(this_00,&local_f0,&local_b0);
    (**(code **)(*plVar6 + 0x30))(plVar6);
  }
  TableBuilder::Finish((TableBuilder *)&local_f0);
  pDVar2 = local_d8;
  (local_d8->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
  if ((_func_int **)local_f0.data_ == (_func_int **)0x0) {
    uVar7 = TableBuilder::FileSize(this_00);
    if (uVar7 == 0) {
      __assert_fail("builder->FileSize() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                    ,0x5c9,
                    "virtual Status leveldb::DBImpl::DumpRange(const std::string &, const Slice &, const Slice &)"
                   );
    }
    TableBuilder::~TableBuilder(this_00);
    operator_delete(this_00);
    (*local_e0->_vptr_WritableFile[5])(&local_f0);
    (pDVar2->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
  }
  else {
    TableBuilder::~TableBuilder(this_00);
    operator_delete(this_00);
  }
  if ((pDVar2->super_DB)._vptr_DB == (_func_int **)0x0) {
    (*local_e0->_vptr_WritableFile[3])(&local_f0);
    (pDVar2->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
  }
  if (local_e0 != (WritableFile *)0x0) {
    (*local_e0->_vptr_WritableFile[1])();
  }
  local_e0 = (WritableFile *)0x0;
  (**(code **)(*plVar6 + 0x50))(&local_f0,plVar6);
  SVar8 = local_f0;
  if (local_f0.data_ != (char *)0x0) {
    operator_delete__(local_f0.data_);
    (**(code **)(*plVar6 + 0x50))(&local_f0,plVar6);
    pp_Var1 = (pDVar2->super_DB)._vptr_DB;
    SVar8.size_ = local_f0.size_;
    SVar8.data_ = (char *)pp_Var1;
    (pDVar2->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
    if (pp_Var1 != (_func_int **)0x0) {
      local_f0.data_ = (char *)pp_Var1;
      operator_delete__(pp_Var1);
      SVar8.size_ = local_f0.size_;
      SVar8.data_ = local_f0.data_;
    }
  }
  local_f0 = SVar8;
  (**(code **)(*plVar6 + 8))(plVar6);
  if (((pDVar2->super_DB)._vptr_DB != (_func_int **)0x0) &&
     ((**(code **)(*(long *)local_d0->_M_string_length + 0x40))
                (&local_c0,(long *)local_d0->_M_string_length,local_c8), local_c0 != (void *)0x0)) {
    operator_delete__(local_c0);
  }
  return (Status)(char *)pDVar2;
}

Assistant:

Status DBImpl::DumpRange(const std::string& fname,
                         const Slice& start, 
                         const Slice& end) {
    Status s;
    WritableFile* file;
    env_->NewWritableFile(fname, &file);

    Options options;
    options.filter_policy = nullptr;
    options.compression = kSnappyCompression;
    TableBuilder* builder = new TableBuilder(options, file);

    ReadOptions readoption;
    readoption.fill_cache = true;
    Iterator *it = NewIterator(readoption);
    //printf("START DUMPING....\n");
    
    for (it->Seek(start); 
         it->Valid() && options.comparator->Compare(it->key(), end) < 0;
         it->Next()) {
       //printf("\rDUMP FOR KEY: %s\n", it->key().ToString().c_str());
       builder->Add(it->key(), it->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      assert(builder->FileSize() > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    // Check for input iterator errors
    if (!it->status().ok()) {
      s = it->status();
    }
    delete it;

    if (s.ok()) {
      // Keep it
    } else {
      env_->DeleteFile(fname);
    }
    return s;
}